

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::ScanStreamForResourcesTokens
          (PDFDocumentHandler *this,PDFStreamInput *inSourceStream,
          StringToStringMap *inMappedResourcesNames,ResourceTokenMarkerList *outResourceMarkers)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IByteReaderWithPosition *pIVar3;
  bool bVar4;
  ResourceTokenMarkerList *pRVar5;
  int iVar6;
  EStatusCode EVar7;
  IByteReader *inSourceStream_00;
  LongFilePositionType LVar8;
  const_iterator cVar9;
  _List_node_base *p_Var10;
  undefined8 uVar11;
  bool bVar12;
  BoolAndString tokenizerResult_1;
  BoolAndString tokenizerResult;
  SimpleStringTokenizer tokenizer;
  ResourceTokenMarker local_118;
  BoolAndString local_f0;
  _Base_ptr local_c8;
  ResourceTokenMarkerList *local_c0;
  string local_b8;
  key_type local_98;
  undefined1 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  SimpleStringTokenizer local_50;
  
  local_c0 = outResourceMarkers;
  inSourceStream_00 = PDFParser::CreateInputStreamReader(this->mParser,inSourceStream);
  if (inSourceStream_00 == (IByteReader *)0x0) {
    EVar7 = eFailure;
  }
  else {
    pIVar3 = this->mPDFStream;
    LVar8 = PDFStreamInput::GetStreamContentStart(inSourceStream);
    (*(pIVar3->super_IByteReader)._vptr_IByteReader[4])(pIVar3,LVar8);
    SimpleStringTokenizer::SimpleStringTokenizer(&local_50);
    SimpleStringTokenizer::SetReadStream(&local_50,inSourceStream_00);
    local_70 = &local_60;
    local_78 = 0;
    local_68 = 0;
    local_60 = 0;
    local_c8 = &(inMappedResourcesNames->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      iVar6 = (*inSourceStream_00->_vptr_IByteReader[3])(inSourceStream_00);
      if ((char)iVar6 == '\0') break;
      SimpleStringTokenizer::GetNextToken_abi_cxx11_(&local_f0,&local_50);
      bVar4 = local_f0.first;
      if (local_f0.first != false) {
        if (local_f0.second._M_string_length == 0) {
          uVar11 = std::__throw_out_of_range_fmt
                             ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                              0);
          SimpleStringTokenizer::~SimpleStringTokenizer(&local_50);
          _Unwind_Resume(uVar11);
        }
        if (*local_f0.second._M_dataplus._M_p == '/') {
          std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_f0.second);
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&inMappedResourcesNames->_M_t,&local_98);
          bVar12 = cVar9._M_node != local_c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar12 = false;
        }
        paVar2 = &local_118.ResourceToken.field_2;
        if (bVar12) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_f0.second);
          LVar8 = SimpleStringTokenizer::GetRecentTokenPosition(&local_50);
          ResourceTokenMarker::ResourceTokenMarker(&local_118,&local_b8,LVar8);
          p_Var10 = (_List_node_base *)operator_new(0x38);
          pRVar5 = local_c0;
          p_Var10[1]._M_next = p_Var10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.ResourceToken._M_dataplus._M_p == paVar2) {
            p_Var10[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_118.ResourceToken.field_2._M_allocated_capacity._1_7_,
                          local_118.ResourceToken.field_2._M_local_buf[0]);
            p_Var10[2]._M_prev = (_List_node_base *)local_118.ResourceToken.field_2._8_8_;
          }
          else {
            p_Var10[1]._M_next = (_List_node_base *)local_118.ResourceToken._M_dataplus._M_p;
            p_Var10[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_118.ResourceToken.field_2._M_allocated_capacity._1_7_,
                          local_118.ResourceToken.field_2._M_local_buf[0]);
          }
          p_Var10[1]._M_prev = (_List_node_base *)local_118.ResourceToken._M_string_length;
          local_118.ResourceToken._M_string_length = 0;
          local_118.ResourceToken.field_2._M_local_buf[0] = '\0';
          p_Var10[3]._M_next = (_List_node_base *)local_118.ResourceTokenPosition;
          local_118.ResourceToken._M_dataplus._M_p = (pointer)paVar2;
          std::__detail::_List_node_base::_M_hook(p_Var10);
          psVar1 = &(pRVar5->
                    super__List_base<ResourceTokenMarker,_std::allocator<ResourceTokenMarker>_>).
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.ResourceToken._M_dataplus._M_p != &local_118.ResourceToken.field_2) {
            operator_delete(local_118.ResourceToken._M_dataplus._M_p,
                            CONCAT71(local_118.ResourceToken.field_2._M_allocated_capacity._1_7_,
                                     local_118.ResourceToken.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.second._M_dataplus._M_p != &local_f0.second.field_2) {
        operator_delete(local_f0.second._M_dataplus._M_p,
                        local_f0.second.field_2._M_allocated_capacity + 1);
      }
    } while (bVar4 != false);
    (*inSourceStream_00->_vptr_IByteReader[1])(inSourceStream_00);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    SimpleStringTokenizer::~SimpleStringTokenizer(&local_50);
    EVar7 = eSuccess;
  }
  return EVar7;
}

Assistant:

EStatusCode PDFDocumentHandler::ScanStreamForResourcesTokens(PDFStreamInput* inSourceStream,const StringToStringMap& inMappedResourcesNames,ResourceTokenMarkerList& outResourceMarkers)
{
	IByteReader* streamReader = mParser->CreateInputStreamReader(inSourceStream);

	if(!streamReader)
		return PDFHummus::eFailure;

	mPDFStream->SetPosition(inSourceStream->GetStreamContentStart());

	// using simplestringtokenizer instead of regular pdfparsertokenizer, as content stream may contain
	// streams, which may have tokens that will be interpreted as pdf tokens (like string start), and so will cause
	// a wrong inclusion of content and so will skip content that should be replaced.
	// There's still risk here, in that there will be a string that like a resource name with forward slash which will be mistaken
	// for a resource usage. this is something to tackle still.
	SimpleStringTokenizer tokenizer;
	tokenizer.SetReadStream(streamReader);

	BoolAndString tokenizerResult;

	while(streamReader->NotEnded())
	{
		BoolAndString tokenizerResult = tokenizer.GetNextToken();

		if(!tokenizerResult.first)
			break;

		// check if this is a token that will need replacement - 1. verify that it's a name 2. verify that it's a name in the input map
		// note that here i don't have to take care of name space chars encoding, as the names are alrady encoded in the map [the new names are never containing space chars]
		if(tokenizerResult.second.at(0) == scSlash && 
			(inMappedResourcesNames.find(tokenizerResult.second.substr(1)) != inMappedResourcesNames.end()))
				outResourceMarkers.push_back(ResourceTokenMarker(tokenizerResult.second.substr(1),tokenizer.GetRecentTokenPosition()));
	}

	delete streamReader;
	return PDFHummus::eSuccess;
}